

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O0

ProcessorBase * __thiscall soul::Compiler::findMainProcessor(Compiler *this,BuildSettings *settings)

{
  uint64_t *this_00;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  Namespace *pNVar4;
  size_type sVar5;
  ProcessorBase *pPVar6;
  pool_ref *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  CompileMessage local_390;
  pool_ptr<soul::AST::ProcessorBase> local_358;
  pool_ptr<soul::AST::ProcessorBase> main;
  CompileMessage local_340;
  CompileMessage local_308;
  pool_ref<soul::AST::ProcessorBase> *local_2d0;
  pool_ref<soul::AST::ProcessorBase> *p;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
  *__range2;
  CompileMessageGroup group;
  vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
  mainProcessors;
  CodeLocation local_168;
  pool_ref<soul::AST::ModuleBase> local_150;
  pool_ptr<soul::AST::ProcessorBase> local_148;
  pool_ptr<soul::AST::ProcessorBase> pb;
  pool_ref<soul::AST::ModuleBase> *m;
  __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
  local_130;
  iterator __end3;
  iterator __begin3;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_c8;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  *local_b0;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  *__range3;
  string local_98;
  undefined1 local_78 [8];
  IdentifierPath path;
  BuildSettings *settings_local;
  Compiler *this_local;
  
  path.pathSections.space[7] = (uint64_t)settings;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::
    vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
    ::vector((vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
              *)(group.messages.space + 0x1b));
    pNVar4 = pool_ptr<soul::AST::Namespace>::operator*(&this->topLevelNamespace);
    ASTUtilities::findAllMainProcessors
              (&pNVar4->super_ModuleBase,
               (vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                *)(group.messages.space + 0x1b));
    sVar5 = std::
            vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
            ::size((vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                    *)(group.messages.space + 0x1b));
    if (1 < sVar5) {
      CompileMessageGroup::CompileMessageGroup((CompileMessageGroup *)&__range2);
      this_00 = group.messages.space + 0x1b;
      __end2 = std::
               vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
               ::begin((vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                        *)this_00);
      p = (pool_ref<soul::AST::ProcessorBase> *)
          std::
          vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
          ::end((vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                 *)this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::ProcessorBase>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>_>
                                         *)&p), bVar1) {
        local_2d0 = __gnu_cxx::
                    __normal_iterator<soul::pool_ref<soul::AST::ProcessorBase>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>_>
                    ::operator*(&__end2);
        Errors::multipleProcessorsMarkedAsMain<>();
        pPVar6 = pool_ref<soul::AST::ProcessorBase>::operator->(local_2d0);
        CodeLocation::CodeLocation
                  ((CodeLocation *)&main,
                   &(pPVar6->super_ModuleBase).super_ASTObject.context.location);
        CompileMessage::withLocation(&local_308,&local_340,(CodeLocation *)&main);
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)&__range2,&local_308);
        CompileMessage::~CompileMessage(&local_308);
        CodeLocation::~CodeLocation((CodeLocation *)&main);
        CompileMessage::~CompileMessage(&local_340);
        __gnu_cxx::
        __normal_iterator<soul::pool_ref<soul::AST::ProcessorBase>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>_>
        ::operator++(&__end2);
      }
      throwError((CompileMessageGroup *)&__range2);
    }
    sVar5 = std::
            vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
            ::size((vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                    *)(group.messages.space + 0x1b));
    if (sVar5 == 1) {
      this_01 = (pool_ref *)
                std::
                vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                ::front((vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
                         *)(group.messages.space + 0x1b));
      this_local = (Compiler *)pool_ref::operator_cast_to_ProcessorBase_(this_01);
    }
    else {
      pNVar4 = pool_ptr<soul::AST::Namespace>::operator*(&this->topLevelNamespace);
      ASTUtilities::scanForProcessorToUseAsMain
                ((ASTUtilities *)&local_358,&pNVar4->super_ModuleBase);
      bVar1 = pool_ptr<soul::AST::ProcessorBase>::operator==(&local_358,(void *)0x0);
      if (bVar1) {
        pNVar4 = pool_ptr<soul::AST::Namespace>::operator->(&this->topLevelNamespace);
        Errors::cannotFindMainProcessor<>();
        AST::Context::throwError
                  (&(pNVar4->super_ModuleBase).super_ASTObject.context,&local_390,false);
      }
      this_local = (Compiler *)pool_ptr<soul::AST::ProcessorBase>::operator*(&local_358);
      pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_358);
    }
    std::
    vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
    ::~vector((vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
               *)(group.messages.space + 0x1b));
    return (ProcessorBase *)this_local;
  }
  std::__cxx11::string::string((string *)&local_98,(string *)(path.pathSections.space[7] + 0x28));
  IdentifierPath::fromString((IdentifierPath *)local_78,&(this->allocator).identifiers,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = IdentifierPath::isValid((IdentifierPath *)local_78);
  if (bVar1) {
    pNVar4 = pool_ptr<soul::AST::Namespace>::operator->(&this->topLevelNamespace);
    IdentifierPath::IdentifierPath((IdentifierPath *)&__begin3,(IdentifierPath *)local_78);
    AST::Scope::getMatchingSubModules
              (&local_c8,&(pNVar4->super_ModuleBase).super_Scope,(IdentifierPath *)&__begin3);
    IdentifierPath::~IdentifierPath((IdentifierPath *)&__begin3);
    local_b0 = &local_c8;
    __end3 = std::
             vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             ::begin(local_b0);
    local_130._M_current =
         (pool_ref<soul::AST::ModuleBase> *)
         std::
         vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
         ::end(local_b0);
    while (bVar1 = __gnu_cxx::operator!=(&__end3,&local_130), bVar1) {
      pb.object = (ProcessorBase *)
                  __gnu_cxx::
                  __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
                  ::operator*(&__end3);
      local_150.object =
           (ModuleBase *)((pb.object)->super_ModuleBase).super_ASTObject._vptr_ASTObject;
      cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_148,&local_150);
      pool_ref<soul::AST::ModuleBase>::~pool_ref(&local_150);
      cVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_148);
      if ((bool)cVar2) {
        this_local = (Compiler *)pool_ptr<soul::AST::ProcessorBase>::operator*(&local_148);
      }
      pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_148);
      if ((bool)cVar2) goto LAB_00317f89;
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
      ::operator++(&__end3);
    }
    cVar2 = '\x02';
LAB_00317f89:
    std::
    vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::~vector(&local_c8);
    if (cVar2 != '\x02') {
      IdentifierPath::~IdentifierPath((IdentifierPath *)local_78);
      return (ProcessorBase *)this_local;
    }
  }
  local_168.sourceCode.object = (SourceCodeText *)0x0;
  local_168.location.data = (char *)0x0;
  CodeLocation::CodeLocation(&local_168);
  Errors::cannotFindMainProcessorWithName<std::__cxx11::string_const&>
            ((CompileMessage *)
             &mainProcessors.
              super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Errors *)(path.pathSections.space[7] + 0x28),args);
  CodeLocation::throwError
            (&local_168,
             (CompileMessage *)
             &mainProcessors.
              super__Vector_base<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
}

Assistant:

AST::ProcessorBase& Compiler::findMainProcessor (const BuildSettings& settings)
{
    if (! settings.mainProcessor.empty())
    {
        auto path = IdentifierPath::fromString (allocator.identifiers, settings.mainProcessor);

        if (path.isValid())
            for (auto& m : topLevelNamespace->getMatchingSubModules (path))
                if (auto pb = cast<AST::ProcessorBase> (m))
                    return *pb;

        CodeLocation().throwError (Errors::cannotFindMainProcessorWithName (settings.mainProcessor));
    }

    std::vector<pool_ref<AST::ProcessorBase>> mainProcessors;
    ASTUtilities::findAllMainProcessors (*topLevelNamespace, mainProcessors);

    if (mainProcessors.size() > 1)
    {
        CompileMessageGroup group;

        for (auto& p : mainProcessors)
            group.messages.push_back (Errors::multipleProcessorsMarkedAsMain().withLocation (p->context.location));

        throwError (group);
    }

    if (mainProcessors.size() == 1)
        return mainProcessors.front();

    auto main = ASTUtilities::scanForProcessorToUseAsMain (*topLevelNamespace);

    if (main == nullptr)
        topLevelNamespace->context.throwError (Errors::cannotFindMainProcessor());

    return *main;
}